

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

uint mcpl_generic_fread_try(mcpl_generic_filehandle_t *fh,char *dest,uint nbytes)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long in_RAX;
  size_t sVar4;
  size_t __n;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  undefined8 uStack_38;
  
  if ((int)nbytes < 0) {
    pcVar7 = "too large nbytes value for mcpl_generic_fread_try";
LAB_001068eb:
    (*mcpl_error_handler)(pcVar7);
    printf("MCPL ERROR: %s\n",
           "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
    exit(1);
  }
  uVar6 = 0;
  uStack_38 = in_RAX;
  do {
    uVar5 = (uint)uVar6;
    if (nbytes == 0) {
      return uVar5;
    }
    __n = 0x8000;
    if (nbytes < 0x8000) {
      __n = (size_t)nbytes;
    }
    if (fh->mode == 0) {
      sVar4 = fread(dest,1,__n,(FILE *)fh->internal);
      iVar8 = (int)sVar4;
      if (sVar4 == __n) {
        dest = dest + sVar4;
        uVar6 = (ulong)(uVar5 + iVar8);
        fh->current_pos = fh->current_pos + sVar4;
        nbytes = nbytes - iVar8;
      }
      else {
        iVar3 = feof((FILE *)fh->internal);
        if (iVar3 == 0) goto LAB_001068e4;
        if (sVar4 != 0) {
          uVar6 = (ulong)(uVar5 + iVar8);
          fh->current_pos = fh->current_pos + sVar4;
        }
        uStack_38 = uVar6 << 0x20;
      }
      if (sVar4 == __n) {
LAB_001068b7:
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else {
      uVar2 = gzread(fh->internal,dest);
      if ((int)uVar2 < 0) {
LAB_001068e4:
        pcVar7 = "Error while reading from file";
        goto LAB_001068eb;
      }
      if (uVar2 != 0) {
        uVar6 = (ulong)(uVar5 + uVar2);
        fh->current_pos = fh->current_pos + uVar6;
        dest = dest + uVar2;
        nbytes = nbytes - uVar2;
        goto LAB_001068b7;
      }
      uStack_38 = uVar6 << 0x20;
      bVar1 = false;
    }
    if (!bVar1) {
      return uStack_38._4_4_;
    }
  } while( true );
}

Assistant:

unsigned mcpl_generic_fread_try( mcpl_generic_filehandle_t* fh,
                                 char * dest, unsigned nbytes )
{
  MCPL_STATIC_ASSERT( sizeof(size_t) >= sizeof(uint32_t) );
  MCPL_STATIC_ASSERT( sizeof(unsigned) >= sizeof(int32_t) );
  MCPL_STATIC_ASSERT( sizeof(z_off_t) >= sizeof(int32_t) );

  if ( nbytes > INT32_MAX )
    mcpl_error("too large nbytes value for mcpl_generic_fread_try");

  unsigned nb_left = nbytes;
  unsigned nb_read = 0;

  while (1) {
    if ( !nb_left )
      return nb_read;
    unsigned nb_totry = ( nb_left > 32768 ? 32768 : nb_left );
    if ( fh->mode ) {
      int rv = gzread((gzFile)(fh->internal), dest, (z_off_t)nb_totry);
      if ( rv < 0 )
        mcpl_error("Error while reading from file");
      if ( rv < 1 )
        return nb_read;
      nb_read += (unsigned)rv;
      fh->current_pos += nb_read;
      dest += rv;
      nb_left -= (unsigned)rv;
    } else {
      size_t rv = fread(dest, 1, (size_t)nb_totry, (FILE*)(fh->internal));
      if ( rv != (size_t)nb_totry ) {
        if ( feof((FILE*)(fh->internal)) ) {
          //not an error, simply reached the end of the file.
          if ( rv ) {
            nb_read += (unsigned)rv;
            fh->current_pos += rv;
          }
          return nb_read;
        }
        mcpl_error("Error while reading from file");
      }
      dest += rv;
      nb_read += (unsigned)rv;
      fh->current_pos += rv;
      nb_left -= (unsigned)rv;
    }

  }
}